

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_cad_association(REF_GRID_conflict ref_grid,char *filename)

{
  REF_FILEPOS RVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  __off_t _Var5;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  REF_LONG RStack_548;
  REF_BOOL verbose;
  REF_LONG ngeom;
  REF_INT geom_keyword;
  REF_INT type;
  REF_FILEPOS key_pos [156];
  REF_FILEPOS next_position;
  undefined1 local_48 [4];
  REF_BOOL available;
  REF_INT dim;
  REF_INT version;
  FILE *file;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_GRID_conflict ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->mpi;
  ref_node = (REF_NODE)ref_grid->geom;
  file = (FILE *)ref_grid->node;
  key_pos[0x9b] = -1;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)ref_grid;
  sVar4 = strlen(filename);
  iVar2 = strcmp((char *)((long)ref_mpi + (sVar4 - 6)),".meshb");
  if (iVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3b3,
           "ref_part_cad_association",3,"expected .meshb extension");
    return 3;
  }
  _dim = (FILE *)0x0;
  if (ref_geom->max == 0) {
    uVar3 = ref_import_meshb_header((char *)ref_mpi,&available,(REF_FILEPOS *)&geom_keyword);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3b7,
             "ref_part_cad_association",(ulong)uVar3,"header");
      return uVar3;
    }
    _dim = fopen((char *)ref_mpi,"r");
    if (_dim == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (_dim == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3bc,
             "ref_part_cad_association","unable to open file");
      return 2;
    }
    uVar3 = ref_import_meshb_jump
                      ((FILE *)_dim,available,(REF_FILEPOS *)&geom_keyword,3,
                       (REF_BOOL *)((long)&next_position + 4),key_pos + 0x9b);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3bf,
             "ref_part_cad_association",(ulong)uVar3,"jump");
      return uVar3;
    }
    if (next_position._4_4_ == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c0,
             "ref_part_cad_association","meshb missing dimension");
      return 1;
    }
    sVar4 = fread(local_48,4,1,_dim);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c1,
             "ref_part_cad_association","dim",1,sVar4);
      return 1;
    }
  }
  uVar3 = ref_mpi_bcast((REF_MPI)ref_geom,&available,1,1);
  if (uVar3 == 0) {
    uVar3 = ref_geom_initialize((REF_GEOM)ref_node);
    if (uVar3 == 0) {
      for (ngeom._4_4_ = 0; ngeom._4_4_ < 3; ngeom._4_4_ = ngeom._4_4_ + 1) {
        if (*(int *)(*(long *)filename_local + 4) == 0) {
          ngeom._0_4_ = ngeom._4_4_ + 0x28;
          uVar3 = ref_import_meshb_jump
                            ((FILE *)_dim,available,(REF_FILEPOS *)&geom_keyword,(int)ngeom,
                             (REF_BOOL *)((long)&next_position + 4),key_pos + 0x9b);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3cd,"ref_part_cad_association",(ulong)uVar3,"jump");
            return uVar3;
          }
          if ((next_position._4_4_ != 0) &&
             (uVar3 = ref_part_meshb_long((FILE *)_dim,available,&stack0xfffffffffffffab8),
             uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3cf,"ref_part_cad_association",(ulong)uVar3,"ngeom");
            return uVar3;
          }
        }
        uVar3 = ref_mpi_bcast((REF_MPI)ref_geom,(void *)((long)&next_position + 4),1,1);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x3d3,"ref_part_cad_association",(ulong)uVar3,"bcast");
          return uVar3;
        }
        if (next_position._4_4_ != 0) {
          uVar3 = ref_mpi_bcast((REF_MPI)ref_geom,&stack0xfffffffffffffab8,1,2);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3d5,"ref_part_cad_association",(ulong)uVar3,"bcast");
            return uVar3;
          }
          uVar3 = ref_part_meshb_geom_bcast
                            ((REF_GEOM)ref_node,RStack_548,ngeom._4_4_,(REF_NODE)file,available,
                             (FILE *)_dim);
          RVar1 = key_pos[0x9b];
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3d8,"ref_part_cad_association",(ulong)uVar3,"part geom bcast");
            return uVar3;
          }
          if ((*(int *)(*(long *)filename_local + 4) == 0) && (_Var5 = ftello(_dim), RVar1 != _Var5)
             ) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3da,"ref_part_cad_association","end location",RVar1,_Var5);
            return 1;
          }
        }
      }
      if (*(int *)(*(long *)filename_local + 4) == 0) {
        fclose(_dim);
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c6,
             "ref_part_cad_association",(ulong)uVar3,"clear out previous assoc");
      ref_grid_local._4_4_ = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c4,
           "ref_part_cad_association",(ulong)uVar3,"bcast");
    ref_grid_local._4_4_ = uVar3;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_association(REF_GRID ref_grid,
                                            const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT type, geom_keyword;
  REF_LONG ngeom;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");

  RSS(ref_geom_initialize(ref_geom), "clear out previous assoc");

  each_ref_type(ref_geom, type) {
    if (ref_grid_once(ref_grid)) {
      geom_keyword = 40 + type;
      RSS(ref_import_meshb_jump(file, version, key_pos, geom_keyword,
                                &available, &next_position),
          "jump");
      if (available) {
        RSS(ref_part_meshb_long(file, version, &ngeom), "ngeom");
        if (verbose) printf("type %d ngeom %ld\n", type, ngeom);
      }
    }
    RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");
    if (available) {
      RSS(ref_mpi_bcast(ref_mpi, &ngeom, 1, REF_LONG_TYPE), "bcast");
      RSS(ref_part_meshb_geom_bcast(ref_geom, ngeom, type, ref_node, version,
                                    file),
          "part geom bcast");
      if (ref_grid_once(ref_grid))
        REIS(next_position, ftello(file), "end location");
    }
  }

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}